

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::TestFactoryImpl<IndexIntervalTest_ValuesSetInConstructor_Test>::CreateTest
          (TestFactoryImpl<IndexIntervalTest_ValuesSetInConstructor_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x38);
  IndexIntervalTest_ValuesSetInConstructor_Test::IndexIntervalTest_ValuesSetInConstructor_Test
            ((IndexIntervalTest_ValuesSetInConstructor_Test *)this_00);
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }